

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

void * mz_zip_extract_archive_file_to_heap
                 (char *pZip_filename,char *pArchive_name,char *pComment,size_t *pSize,mz_uint flags
                 )

{
  mz_bool mVar1;
  int iVar2;
  mz_zip_archive *in_RCX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  void *p;
  mz_zip_archive zip_archive;
  int file_index;
  undefined1 local_90 [12];
  mz_uint32 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  mz_zip_archive *in_stack_ffffffffffffff88;
  mz_uint in_stack_ffffffffffffff9c;
  size_t *in_stack_ffffffffffffffa0;
  mz_uint in_stack_ffffffffffffffac;
  mz_zip_archive *in_stack_ffffffffffffffb0;
  mz_uint in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  mz_zip_archive *local_8;
  
  local_8 = (mz_zip_archive *)0x0;
  if (in_RCX != (mz_zip_archive *)0x0) {
    in_RCX->m_archive_size = 0;
  }
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_8 = (mz_zip_archive *)0x0;
  }
  else {
    memset(local_90,0,0x60);
    mVar1 = mz_zip_reader_init_file
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
    if (mVar1 == 0) {
      local_8 = (mz_zip_archive *)0x0;
    }
    else {
      iVar2 = mz_zip_reader_locate_file
                        (in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      if (-1 < iVar2) {
        local_8 = (mz_zip_archive *)
                  mz_zip_reader_extract_to_heap
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
      mz_zip_reader_end(local_8);
    }
  }
  return local_8;
}

Assistant:

void* mz_zip_extract_archive_file_to_heap(const char* pZip_filename, const char* pArchive_name, const char* pComment, size_t* pSize, mz_uint flags) {
  int file_index;
  mz_zip_archive zip_archive;
  void* p = NULL;

  if (pSize)
    *pSize = 0;

  if ((!pZip_filename) || (!pArchive_name))
    return NULL;

  MZ_CLEAR_OBJ(zip_archive);
  if (!mz_zip_reader_init_file(&zip_archive, pZip_filename, flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
    return NULL;

  if ((file_index = mz_zip_reader_locate_file(&zip_archive, pArchive_name, pComment, flags)) >= 0)
    p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);

  mz_zip_reader_end(&zip_archive);
  return p;
}